

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mat *this_01;
  Mat *this_02;
  size_t sVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  void *pvVar9;
  uint uVar10;
  int i_65;
  float *pfVar11;
  int x_28;
  int iVar12;
  uint uVar13;
  long lVar14;
  float *pfVar15;
  void *pvVar16;
  int x_2;
  ulong uVar17;
  int x_29;
  uint uVar18;
  long lVar19;
  int y_14;
  uint uVar20;
  uint uVar21;
  int i_63;
  float fVar22;
  float fVar23;
  Mat local_88;
  ulong local_48;
  void *local_40;
  int local_34;
  
  if ((uint)this->op_type < 9) {
    this_01 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    this_00 = this_01 + 1;
    this_02 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    switch(this->op_type) {
    case 0:
      uVar13 = this_01->w;
      lVar14 = (long)(int)uVar13;
      sVar4 = this_01->elemsize;
      uVar1 = this_01[1].w;
      lVar19 = (long)(int)uVar1;
      uVar2 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar5 = (ulong)uVar10;
      uVar21 = uVar2 * uVar1;
      iVar12 = this_01->dims;
      if (iVar12 == 1) {
        iVar12 = this_01[1].dims;
        if (uVar13 == 1) {
          if (iVar12 == 1) {
            Mat::create(this_02,uVar1,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) + fVar22;
            }
          }
          else if (iVar12 == 2) {
            Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) + fVar22;
            }
          }
          else {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_00,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar9 + uVar5 * 4) = *(float *)((long)pvVar7 + uVar5 * 4) + fVar22
                ;
              }
            }
          }
        }
        else if (iVar12 == 1) {
          Mat::create(this_02,uVar13,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar22 = *this_01[1].data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) + fVar22;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar7 + uVar6 * 4) =
                   *(float *)((long)pvVar16 + uVar6 * 4) + *(float *)((long)pvVar9 + uVar6 * 4);
            }
          }
        }
        else {
          if (iVar12 != 2) {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar5 = 0;
            }
            for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)this_01->data + uVar6 * 4);
              Mat::channel(&local_88,this_00,(int)uVar6);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,(int)uVar6);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
                *(float *)((long)pvVar9 + uVar8 * 4) = *(float *)((long)pvVar7 + uVar8 * 4) + fVar22
                ;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
            fVar22 = *(float *)((long)pvVar9 + uVar6 * 4);
            for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
              *(float *)((long)pvVar7 + uVar8 * 4) = *(float *)((long)pvVar16 + uVar8 * 4) + fVar22;
            }
            pvVar7 = (void *)((long)pvVar7 + lVar19 * 4);
            pvVar16 = (void *)((long)pvVar16 + lVar19 * 4);
          }
        }
      }
      else {
        uVar3 = this_01->h;
        uVar20 = uVar3 * uVar13;
        if (iVar12 != 2) {
          if (iVar12 != 3) {
            return 0;
          }
          uVar18 = this_01->c;
          uVar5 = (ulong)uVar18;
          if (this_01[1].dims != 3) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar22 = *this_00->data;
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                if ((int)uVar18 < 1) {
                  uVar18 = 0;
                }
                for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
                  Mat::channel(&local_88,this_01,uVar13);
                  pvVar7 = local_88.data;
                  Mat::~Mat(&local_88);
                  Mat::channel(&local_88,this_02,uVar13);
                  pvVar9 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                    *(float *)((long)pvVar9 + uVar5 * 4) =
                         *(float *)((long)pvVar7 + uVar5 * 4) + fVar22;
                  }
                }
                return 0;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar18 < 1) {
                uVar5 = 0;
              }
              for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
                Mat::channel(&local_88,this_01,(int)uVar6);
                pvVar7 = local_88.data;
                Mat::~Mat(&local_88);
                fVar22 = *(float *)((long)this_01[1].data + uVar6 * 4);
                Mat::channel(&local_88,this_02,(int)uVar6);
                pvVar9 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar8 = 0; uVar20 != uVar8; uVar8 = uVar8 + 1) {
                  *(float *)((long)pvVar9 + uVar8 * 4) =
                       *(float *)((long)pvVar7 + uVar8 * 4) + fVar22;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            local_40 = (void *)(ulong)uVar3;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pfVar11 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              iVar12 = this_01[1].w;
              sVar4 = this_01[1].elemsize;
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pfVar15 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; (void *)uVar6 != local_40; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)pvVar7 +
                                   uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
                for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar15[uVar8] = pfVar11[uVar8] + fVar22;
                }
                pfVar15 = pfVar15 + lVar14;
                pfVar11 = pfVar11 + lVar14;
              }
            }
            return 0;
          }
          if ((uVar2 == 1 && uVar1 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *pvVar9 + *(float *)((long)pvVar7 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar1 == uVar13) && (uVar10 == 1 && uVar2 == uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar7 + uVar5 * 4) + *(float *)((long)pvVar9 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == 1 && uVar13 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar1,uVar2,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar9 + uVar5 * 4) + *pvVar7;
              }
            }
            return 0;
          }
          if ((uVar1 != uVar13) || (uVar18 != 1 || uVar2 != uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar9 + uVar5 * 4) + *(float *)((long)pvVar7 + uVar5 * 4);
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pvVar9 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pvVar16 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar16 + uVar5 * 4) =
                   *(float *)((long)pvVar9 + uVar5 * 4) + *(float *)((long)pvVar7 + uVar5 * 4);
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            iVar12 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pfVar15 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar7 +
                                 uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
              for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                pfVar15[uVar8] = pfVar11[uVar8] + fVar22;
              }
              pfVar15 = pfVar15 + lVar19;
              pfVar11 = pfVar11 + lVar19;
            }
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) =
                 *(float *)((long)pvVar16 + uVar5 * 4) + *(float *)((long)pvVar9 + uVar5 * 4);
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar22 = *this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) + fVar22;
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar16 = this_01[1].data;
        uVar5 = 0;
        if (0 < (int)uVar13) {
          uVar5 = (ulong)uVar13;
        }
        uVar6 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar6 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          fVar22 = *(float *)((long)pvVar16 + uVar8 * 4);
          for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)((long)pvVar7 + uVar17 * 4) = *(float *)((long)pvVar9 + uVar17 * 4) + fVar22;
          }
          pvVar7 = (void *)((long)pvVar7 + lVar14 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar14 * 4);
        }
      }
      break;
    case 1:
      uVar13 = this_01->w;
      lVar14 = (long)(int)uVar13;
      sVar4 = this_01->elemsize;
      uVar1 = this_01[1].w;
      lVar19 = (long)(int)uVar1;
      uVar2 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar5 = (ulong)uVar10;
      uVar21 = uVar2 * uVar1;
      iVar12 = this_01->dims;
      if (iVar12 == 1) {
        iVar12 = this_01[1].dims;
        if (uVar13 == 1) {
          if (iVar12 == 1) {
            Mat::create(this_02,uVar1,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar22 - *(float *)((long)pvVar9 + uVar5 * 4);
            }
          }
          else if (iVar12 == 2) {
            Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar22 - *(float *)((long)pvVar9 + uVar5 * 4);
            }
          }
          else {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_00,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar9 + uVar5 * 4) = fVar22 - *(float *)((long)pvVar7 + uVar5 * 4)
                ;
              }
            }
          }
        }
        else if (iVar12 == 1) {
          Mat::create(this_02,uVar13,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar22 = *this_01[1].data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) - fVar22;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar7 + uVar6 * 4) =
                   *(float *)((long)pvVar9 + uVar6 * 4) - *(float *)((long)pvVar16 + uVar6 * 4);
            }
          }
        }
        else {
          if (iVar12 != 2) {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar5 = 0;
            }
            for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)this_01->data + uVar6 * 4);
              Mat::channel(&local_88,this_00,(int)uVar6);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,(int)uVar6);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
                *(float *)((long)pvVar9 + uVar8 * 4) = fVar22 - *(float *)((long)pvVar7 + uVar8 * 4)
                ;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
            fVar22 = *(float *)((long)pvVar9 + uVar6 * 4);
            for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
              *(float *)((long)pvVar7 + uVar8 * 4) = fVar22 - *(float *)((long)pvVar16 + uVar8 * 4);
            }
            pvVar7 = (void *)((long)pvVar7 + lVar19 * 4);
            pvVar16 = (void *)((long)pvVar16 + lVar19 * 4);
          }
        }
      }
      else {
        uVar3 = this_01->h;
        uVar20 = uVar3 * uVar13;
        if (iVar12 != 2) {
          if (iVar12 != 3) {
            return 0;
          }
          uVar18 = this_01->c;
          uVar5 = (ulong)uVar18;
          if (this_01[1].dims != 3) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar22 = *this_00->data;
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                if ((int)uVar18 < 1) {
                  uVar18 = 0;
                }
                for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
                  Mat::channel(&local_88,this_01,uVar13);
                  pvVar7 = local_88.data;
                  Mat::~Mat(&local_88);
                  Mat::channel(&local_88,this_02,uVar13);
                  pvVar9 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                    *(float *)((long)pvVar9 + uVar5 * 4) =
                         *(float *)((long)pvVar7 + uVar5 * 4) - fVar22;
                  }
                }
                return 0;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar18 < 1) {
                uVar5 = 0;
              }
              for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
                Mat::channel(&local_88,this_01,(int)uVar6);
                pvVar7 = local_88.data;
                Mat::~Mat(&local_88);
                fVar22 = *(float *)((long)this_01[1].data + uVar6 * 4);
                Mat::channel(&local_88,this_02,(int)uVar6);
                pvVar9 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar8 = 0; uVar20 != uVar8; uVar8 = uVar8 + 1) {
                  *(float *)((long)pvVar9 + uVar8 * 4) =
                       *(float *)((long)pvVar7 + uVar8 * 4) - fVar22;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            local_40 = (void *)(ulong)uVar3;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pfVar11 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              iVar12 = this_01[1].w;
              sVar4 = this_01[1].elemsize;
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pfVar15 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; (void *)uVar6 != local_40; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)pvVar7 +
                                   uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
                for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar15[uVar8] = pfVar11[uVar8] - fVar22;
                }
                pfVar15 = pfVar15 + lVar14;
                pfVar11 = pfVar11 + lVar14;
              }
            }
            return 0;
          }
          if ((uVar2 == 1 && uVar1 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar7 + uVar5 * 4) - *pvVar9;
              }
            }
            return 0;
          }
          if ((uVar1 == uVar13) && (uVar10 == 1 && uVar2 == uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar9 + uVar5 * 4) - *(float *)((long)pvVar7 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == 1 && uVar13 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar1,uVar2,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *pvVar7 - *(float *)((long)pvVar9 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar1 != uVar13) || (uVar18 != 1 || uVar2 != uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar7 + uVar5 * 4) - *(float *)((long)pvVar9 + uVar5 * 4);
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pvVar9 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pvVar16 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar16 + uVar5 * 4) =
                   *(float *)((long)pvVar7 + uVar5 * 4) - *(float *)((long)pvVar9 + uVar5 * 4);
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            iVar12 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pfVar15 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar7 +
                                 uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
              for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                pfVar15[uVar8] = fVar22 - pfVar11[uVar8];
              }
              pfVar15 = pfVar15 + lVar19;
              pfVar11 = pfVar11 + lVar19;
            }
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) =
                 *(float *)((long)pvVar9 + uVar5 * 4) - *(float *)((long)pvVar16 + uVar5 * 4);
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar22 = *this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) - fVar22;
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar16 = this_01[1].data;
        uVar5 = 0;
        if (0 < (int)uVar13) {
          uVar5 = (ulong)uVar13;
        }
        uVar6 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar6 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          fVar22 = *(float *)((long)pvVar16 + uVar8 * 4);
          for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)((long)pvVar7 + uVar17 * 4) = *(float *)((long)pvVar9 + uVar17 * 4) - fVar22;
          }
          pvVar7 = (void *)((long)pvVar7 + lVar14 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar14 * 4);
        }
      }
      break;
    case 2:
      uVar13 = this_01->w;
      lVar14 = (long)(int)uVar13;
      sVar4 = this_01->elemsize;
      uVar1 = this_01[1].w;
      lVar19 = (long)(int)uVar1;
      uVar2 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar5 = (ulong)uVar10;
      uVar21 = uVar2 * uVar1;
      iVar12 = this_01->dims;
      if (iVar12 == 1) {
        iVar12 = this_01[1].dims;
        if (uVar13 == 1) {
          if (iVar12 == 1) {
            Mat::create(this_02,uVar1,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) * fVar22;
            }
          }
          else if (iVar12 == 2) {
            Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) * fVar22;
            }
          }
          else {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_00,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar9 + uVar5 * 4) = *(float *)((long)pvVar7 + uVar5 * 4) * fVar22
                ;
              }
            }
          }
        }
        else if (iVar12 == 1) {
          Mat::create(this_02,uVar13,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar22 = *this_01[1].data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) * fVar22;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar7 + uVar6 * 4) =
                   *(float *)((long)pvVar16 + uVar6 * 4) * *(float *)((long)pvVar9 + uVar6 * 4);
            }
          }
        }
        else {
          if (iVar12 != 2) {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar5 = 0;
            }
            for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)this_01->data + uVar6 * 4);
              Mat::channel(&local_88,this_00,(int)uVar6);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,(int)uVar6);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
                *(float *)((long)pvVar9 + uVar8 * 4) = *(float *)((long)pvVar7 + uVar8 * 4) * fVar22
                ;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
            fVar22 = *(float *)((long)pvVar9 + uVar6 * 4);
            for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
              *(float *)((long)pvVar7 + uVar8 * 4) = *(float *)((long)pvVar16 + uVar8 * 4) * fVar22;
            }
            pvVar7 = (void *)((long)pvVar7 + lVar19 * 4);
            pvVar16 = (void *)((long)pvVar16 + lVar19 * 4);
          }
        }
      }
      else {
        uVar3 = this_01->h;
        uVar20 = uVar3 * uVar13;
        if (iVar12 != 2) {
          if (iVar12 != 3) {
            return 0;
          }
          uVar18 = this_01->c;
          uVar5 = (ulong)uVar18;
          if (this_01[1].dims != 3) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar22 = *this_00->data;
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                if ((int)uVar18 < 1) {
                  uVar18 = 0;
                }
                for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
                  Mat::channel(&local_88,this_01,uVar13);
                  pvVar7 = local_88.data;
                  Mat::~Mat(&local_88);
                  Mat::channel(&local_88,this_02,uVar13);
                  pvVar9 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                    *(float *)((long)pvVar9 + uVar5 * 4) =
                         *(float *)((long)pvVar7 + uVar5 * 4) * fVar22;
                  }
                }
                return 0;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar18 < 1) {
                uVar5 = 0;
              }
              for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
                Mat::channel(&local_88,this_01,(int)uVar6);
                pvVar7 = local_88.data;
                Mat::~Mat(&local_88);
                fVar22 = *(float *)((long)this_01[1].data + uVar6 * 4);
                Mat::channel(&local_88,this_02,(int)uVar6);
                pvVar9 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar8 = 0; uVar20 != uVar8; uVar8 = uVar8 + 1) {
                  *(float *)((long)pvVar9 + uVar8 * 4) =
                       *(float *)((long)pvVar7 + uVar8 * 4) * fVar22;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            local_40 = (void *)(ulong)uVar3;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pfVar11 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              iVar12 = this_01[1].w;
              sVar4 = this_01[1].elemsize;
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pfVar15 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; (void *)uVar6 != local_40; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)pvVar7 +
                                   uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
                for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar15[uVar8] = pfVar11[uVar8] * fVar22;
                }
                pfVar15 = pfVar15 + lVar14;
                pfVar11 = pfVar11 + lVar14;
              }
            }
            return 0;
          }
          if ((uVar2 == 1 && uVar1 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *pvVar9 * *(float *)((long)pvVar7 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar1 == uVar13) && (uVar10 == 1 && uVar2 == uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar7 + uVar5 * 4) * *(float *)((long)pvVar9 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == 1 && uVar13 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar1,uVar2,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar9 + uVar5 * 4) * *pvVar7;
              }
            }
            return 0;
          }
          if ((uVar1 != uVar13) || (uVar18 != 1 || uVar2 != uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar9 + uVar5 * 4) * *(float *)((long)pvVar7 + uVar5 * 4);
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pvVar9 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pvVar16 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar16 + uVar5 * 4) =
                   *(float *)((long)pvVar9 + uVar5 * 4) * *(float *)((long)pvVar7 + uVar5 * 4);
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            iVar12 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pfVar15 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar7 +
                                 uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
              for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                pfVar15[uVar8] = pfVar11[uVar8] * fVar22;
              }
              pfVar15 = pfVar15 + lVar19;
              pfVar11 = pfVar11 + lVar19;
            }
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) =
                 *(float *)((long)pvVar16 + uVar5 * 4) * *(float *)((long)pvVar9 + uVar5 * 4);
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar22 = *this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) * fVar22;
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar16 = this_01[1].data;
        uVar5 = 0;
        if (0 < (int)uVar13) {
          uVar5 = (ulong)uVar13;
        }
        uVar6 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar6 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          fVar22 = *(float *)((long)pvVar16 + uVar8 * 4);
          for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)((long)pvVar7 + uVar17 * 4) = *(float *)((long)pvVar9 + uVar17 * 4) * fVar22;
          }
          pvVar7 = (void *)((long)pvVar7 + lVar14 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar14 * 4);
        }
      }
      break;
    case 3:
      uVar13 = this_01->w;
      lVar14 = (long)(int)uVar13;
      sVar4 = this_01->elemsize;
      uVar1 = this_01[1].w;
      lVar19 = (long)(int)uVar1;
      uVar2 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar5 = (ulong)uVar10;
      uVar21 = uVar2 * uVar1;
      iVar12 = this_01->dims;
      if (iVar12 == 1) {
        iVar12 = this_01[1].dims;
        if (uVar13 == 1) {
          if (iVar12 == 1) {
            Mat::create(this_02,uVar1,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar22 / *(float *)((long)pvVar9 + uVar5 * 4);
            }
          }
          else if (iVar12 == 2) {
            Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar22 / *(float *)((long)pvVar9 + uVar5 * 4);
            }
          }
          else {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_00,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar9 + uVar5 * 4) = fVar22 / *(float *)((long)pvVar7 + uVar5 * 4)
                ;
              }
            }
          }
        }
        else if (iVar12 == 1) {
          Mat::create(this_02,uVar13,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            uVar5 = (ulong)uVar13;
            if ((int)uVar13 < 1) {
              uVar5 = 0;
            }
            fVar22 = *this_01[1].data;
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar7 + uVar6 * 4) =
                   *(float *)((long)pvVar9 + uVar6 * 4) * (1.0 / fVar22);
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar7 + uVar6 * 4) =
                   *(float *)((long)pvVar9 + uVar6 * 4) / *(float *)((long)pvVar16 + uVar6 * 4);
            }
          }
        }
        else {
          if (iVar12 != 2) {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar5 = 0;
            }
            for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)this_01->data + uVar6 * 4);
              Mat::channel(&local_88,this_00,(int)uVar6);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,(int)uVar6);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
                *(float *)((long)pvVar9 + uVar8 * 4) = fVar22 / *(float *)((long)pvVar7 + uVar8 * 4)
                ;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          uVar6 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar6 = 0;
          }
          for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
            fVar22 = *(float *)((long)pvVar9 + uVar8 * 4);
            for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
              *(float *)((long)pvVar7 + uVar17 * 4) =
                   fVar22 / *(float *)((long)pvVar16 + uVar17 * 4);
            }
            pvVar7 = (void *)((long)pvVar7 + lVar19 * 4);
            pvVar16 = (void *)((long)pvVar16 + lVar19 * 4);
          }
        }
      }
      else {
        uVar3 = this_01->h;
        uVar20 = uVar3 * uVar13;
        if (iVar12 != 2) {
          if (iVar12 != 3) {
            return 0;
          }
          uVar18 = this_01->c;
          uVar5 = (ulong)uVar18;
          if (this_01[1].dims != 3) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                if ((int)uVar18 < 1) {
                  uVar18 = 0;
                }
                fVar22 = *this_00->data;
                for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
                  Mat::channel(&local_88,this_01,uVar13);
                  pvVar7 = local_88.data;
                  Mat::~Mat(&local_88);
                  Mat::channel(&local_88,this_02,uVar13);
                  pvVar9 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                    *(float *)((long)pvVar9 + uVar5 * 4) =
                         *(float *)((long)pvVar7 + uVar5 * 4) * (1.0 / fVar22);
                  }
                }
                return 0;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar18 < 1) {
                uVar5 = 0;
              }
              for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
                Mat::channel(&local_88,this_01,(int)uVar6);
                pvVar7 = local_88.data;
                Mat::~Mat(&local_88);
                fVar22 = *(float *)((long)this_01[1].data + uVar6 * 4);
                Mat::channel(&local_88,this_02,(int)uVar6);
                pvVar9 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar8 = 0; uVar20 != uVar8; uVar8 = uVar8 + 1) {
                  *(float *)((long)pvVar9 + uVar8 * 4) =
                       *(float *)((long)pvVar7 + uVar8 * 4) * (1.0 / fVar22);
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            local_40 = (void *)(ulong)uVar3;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pfVar11 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              iVar12 = this_01[1].w;
              sVar4 = this_01[1].elemsize;
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pfVar15 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; (void *)uVar6 != local_40; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)pvVar7 +
                                   uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
                for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar15[uVar8] = pfVar11[uVar8] * (1.0 / fVar22);
                }
                pfVar15 = pfVar15 + lVar14;
                pfVar11 = pfVar11 + lVar14;
              }
            }
            return 0;
          }
          if ((uVar2 == 1 && uVar1 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar7 + uVar5 * 4) / *pvVar9;
              }
            }
            return 0;
          }
          if ((uVar1 == uVar13) && (uVar10 == 1 && uVar2 == uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar9 + uVar5 * 4) / *(float *)((long)pvVar7 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == 1 && uVar13 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar1,uVar2,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *pvVar7 / *(float *)((long)pvVar9 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar1 != uVar13) || (uVar18 != 1 || uVar2 != uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar7 + uVar5 * 4) / *(float *)((long)pvVar9 + uVar5 * 4);
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pvVar9 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pvVar16 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar16 + uVar5 * 4) =
                   *(float *)((long)pvVar7 + uVar5 * 4) / *(float *)((long)pvVar9 + uVar5 * 4);
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            iVar12 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pfVar15 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar7 +
                                 uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
              for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                pfVar15[uVar8] = fVar22 / pfVar11[uVar8];
              }
              pfVar15 = pfVar15 + lVar19;
              pfVar11 = pfVar11 + lVar19;
            }
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) =
                 *(float *)((long)pvVar9 + uVar5 * 4) / *(float *)((long)pvVar16 + uVar5 * 4);
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          fVar22 = *this_01[1].data;
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) =
                 *(float *)((long)pvVar9 + uVar5 * 4) * (1.0 / fVar22);
          }
          return 0;
        }
        uVar5 = 0;
        if (0 < (int)uVar13) {
          uVar5 = (ulong)uVar13;
        }
        pvVar9 = this_01->data;
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        pvVar16 = this_01[1].data;
        for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
          fVar22 = *(float *)((long)pvVar16 + uVar6 * 4);
          for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)pvVar7 + uVar8 * 4) =
                 *(float *)((long)pvVar9 + uVar8 * 4) * (1.0 / fVar22);
          }
          pvVar7 = (void *)((long)pvVar7 + lVar14 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar14 * 4);
        }
      }
      break;
    case 4:
      uVar13 = this_01->w;
      lVar14 = (long)(int)uVar13;
      sVar4 = this_01->elemsize;
      uVar1 = this_01[1].w;
      lVar19 = (long)(int)uVar1;
      uVar2 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar5 = (ulong)uVar10;
      uVar21 = uVar2 * uVar1;
      iVar12 = this_01->dims;
      if (iVar12 == 1) {
        iVar12 = this_01[1].dims;
        if (uVar13 == 1) {
          if (iVar12 == 1) {
            Mat::create(this_02,uVar1,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
              if (fVar23 <= fVar22) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
            }
          }
          else if (iVar12 == 2) {
            Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
              if (fVar23 <= fVar22) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
            }
          }
          else {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_00,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                fVar23 = *(float *)((long)pvVar7 + uVar5 * 4);
                if (*(float *)((long)pvVar7 + uVar5 * 4) <= fVar22) {
                  fVar23 = fVar22;
                }
                *(float *)((long)pvVar9 + uVar5 * 4) = fVar23;
              }
            }
          }
        }
        else if (iVar12 == 1) {
          Mat::create(this_02,uVar13,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar22 = *this_01[1].data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
              if (fVar23 <= fVar22) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar16 + uVar6 * 4);
              fVar23 = *(float *)((long)pvVar9 + uVar6 * 4);
              if (fVar22 <= fVar23) {
                fVar22 = fVar23;
              }
              *(float *)((long)pvVar7 + uVar6 * 4) = fVar22;
            }
          }
        }
        else {
          if (iVar12 != 2) {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar5 = 0;
            }
            for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)this_01->data + uVar6 * 4);
              Mat::channel(&local_88,this_00,(int)uVar6);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,(int)uVar6);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
                fVar23 = *(float *)((long)pvVar7 + uVar8 * 4);
                if (*(float *)((long)pvVar7 + uVar8 * 4) <= fVar22) {
                  fVar23 = fVar22;
                }
                *(float *)((long)pvVar9 + uVar8 * 4) = fVar23;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
            fVar22 = *(float *)((long)pvVar9 + uVar6 * 4);
            for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
              fVar23 = *(float *)((long)pvVar16 + uVar8 * 4);
              if (fVar23 <= fVar22) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar7 + uVar8 * 4) = fVar23;
            }
            pvVar7 = (void *)((long)pvVar7 + lVar19 * 4);
            pvVar16 = (void *)((long)pvVar16 + lVar19 * 4);
          }
        }
      }
      else {
        uVar3 = this_01->h;
        uVar20 = uVar3 * uVar13;
        if (iVar12 != 2) {
          if (iVar12 != 3) {
            return 0;
          }
          uVar18 = this_01->c;
          uVar5 = (ulong)uVar18;
          if (this_01[1].dims != 3) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar22 = *this_00->data;
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                if ((int)uVar18 < 1) {
                  uVar18 = 0;
                }
                for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
                  Mat::channel(&local_88,this_01,uVar13);
                  pvVar7 = local_88.data;
                  Mat::~Mat(&local_88);
                  Mat::channel(&local_88,this_02,uVar13);
                  pvVar9 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                    fVar23 = *(float *)((long)pvVar7 + uVar5 * 4);
                    if (*(float *)((long)pvVar7 + uVar5 * 4) <= fVar22) {
                      fVar23 = fVar22;
                    }
                    *(float *)((long)pvVar9 + uVar5 * 4) = fVar23;
                  }
                }
                return 0;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar18 < 1) {
                uVar5 = 0;
              }
              for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
                Mat::channel(&local_88,this_01,(int)uVar6);
                pvVar7 = local_88.data;
                Mat::~Mat(&local_88);
                fVar22 = *(float *)((long)this_01[1].data + uVar6 * 4);
                Mat::channel(&local_88,this_02,(int)uVar6);
                pvVar9 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar8 = 0; uVar20 != uVar8; uVar8 = uVar8 + 1) {
                  fVar23 = *(float *)((long)pvVar7 + uVar8 * 4);
                  if (*(float *)((long)pvVar7 + uVar8 * 4) <= fVar22) {
                    fVar23 = fVar22;
                  }
                  *(float *)((long)pvVar9 + uVar8 * 4) = fVar23;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            local_40 = (void *)(ulong)uVar3;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pfVar11 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              iVar12 = this_01[1].w;
              sVar4 = this_01[1].elemsize;
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pfVar15 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; (void *)uVar6 != local_40; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)pvVar7 +
                                   uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
                for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                  fVar23 = pfVar11[uVar8];
                  if (pfVar11[uVar8] <= fVar22) {
                    fVar23 = fVar22;
                  }
                  pfVar15[uVar8] = fVar23;
                }
                pfVar15 = pfVar15 + lVar14;
                pfVar11 = pfVar11 + lVar14;
              }
            }
            return 0;
          }
          if ((uVar2 == 1 && uVar1 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = *pvVar9;
                if (*pvVar9 <= *(float *)((long)pvVar7 + uVar5 * 4)) {
                  fVar22 = *(float *)((long)pvVar7 + uVar5 * 4);
                }
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          if ((uVar1 == uVar13) && (uVar10 == 1 && uVar2 == uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = *(float *)((long)pvVar7 + uVar5 * 4);
                if (fVar22 <= *(float *)((long)pvVar9 + uVar5 * 4)) {
                  fVar22 = *(float *)((long)pvVar9 + uVar5 * 4);
                }
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          if ((uVar3 == 1 && uVar13 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar1,uVar2,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = *(float *)((long)pvVar9 + uVar5 * 4);
                if (*(float *)((long)pvVar9 + uVar5 * 4) <= *pvVar7) {
                  fVar22 = *pvVar7;
                }
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          if ((uVar1 != uVar13) || (uVar18 != 1 || uVar2 != uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = *(float *)((long)pvVar9 + uVar5 * 4);
                if (*(float *)((long)pvVar9 + uVar5 * 4) <= *(float *)((long)pvVar7 + uVar5 * 4)) {
                  fVar22 = *(float *)((long)pvVar7 + uVar5 * 4);
                }
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pvVar9 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pvVar16 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              fVar22 = *(float *)((long)pvVar7 + uVar5 * 4);
              fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
              if (*(float *)((long)pvVar9 + uVar5 * 4) <= fVar22) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar16 + uVar5 * 4) = fVar23;
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            iVar12 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pfVar15 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar7 +
                                 uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
              for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                fVar23 = pfVar11[uVar8];
                if (pfVar11[uVar8] <= fVar22) {
                  fVar23 = fVar22;
                }
                pfVar15[uVar8] = fVar23;
              }
              pfVar15 = pfVar15 + lVar19;
              pfVar11 = pfVar11 + lVar19;
            }
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            fVar22 = *(float *)((long)pvVar16 + uVar5 * 4);
            fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
            if (fVar22 <= fVar23) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar7 + uVar5 * 4) = fVar22;
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar22 = *this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
            if (fVar23 <= fVar22) {
              fVar23 = fVar22;
            }
            *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar16 = this_01[1].data;
        uVar5 = 0;
        if (0 < (int)uVar13) {
          uVar5 = (ulong)uVar13;
        }
        uVar6 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar6 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          fVar22 = *(float *)((long)pvVar16 + uVar8 * 4);
          for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
            fVar23 = *(float *)((long)pvVar9 + uVar17 * 4);
            if (fVar23 <= fVar22) {
              fVar23 = fVar22;
            }
            *(float *)((long)pvVar7 + uVar17 * 4) = fVar23;
          }
          pvVar7 = (void *)((long)pvVar7 + lVar14 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar14 * 4);
        }
      }
      break;
    case 5:
      uVar13 = this_01->w;
      lVar14 = (long)(int)uVar13;
      sVar4 = this_01->elemsize;
      uVar1 = this_01[1].w;
      lVar19 = (long)(int)uVar1;
      uVar2 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar5 = (ulong)uVar10;
      uVar21 = uVar2 * uVar1;
      iVar12 = this_01->dims;
      if (iVar12 == 1) {
        iVar12 = this_01[1].dims;
        if (uVar13 == 1) {
          if (iVar12 == 1) {
            Mat::create(this_02,uVar1,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
              if (fVar22 <= fVar23) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
            }
          }
          else if (iVar12 == 2) {
            Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
              if (fVar22 <= fVar23) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
            }
          }
          else {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_00,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                fVar23 = *(float *)((long)pvVar7 + uVar5 * 4);
                if (fVar22 <= *(float *)((long)pvVar7 + uVar5 * 4)) {
                  fVar23 = fVar22;
                }
                *(float *)((long)pvVar9 + uVar5 * 4) = fVar23;
              }
            }
          }
        }
        else if (iVar12 == 1) {
          Mat::create(this_02,uVar13,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar22 = *this_01[1].data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
              if (fVar22 <= fVar23) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar16 + uVar6 * 4);
              fVar23 = *(float *)((long)pvVar9 + uVar6 * 4);
              if (fVar23 <= fVar22) {
                fVar22 = fVar23;
              }
              *(float *)((long)pvVar7 + uVar6 * 4) = fVar22;
            }
          }
        }
        else {
          if (iVar12 != 2) {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar5 = 0;
            }
            for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)this_01->data + uVar6 * 4);
              Mat::channel(&local_88,this_00,(int)uVar6);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,(int)uVar6);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
                fVar23 = *(float *)((long)pvVar7 + uVar8 * 4);
                if (fVar22 <= *(float *)((long)pvVar7 + uVar8 * 4)) {
                  fVar23 = fVar22;
                }
                *(float *)((long)pvVar9 + uVar8 * 4) = fVar23;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
            fVar22 = *(float *)((long)pvVar9 + uVar6 * 4);
            for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
              fVar23 = *(float *)((long)pvVar16 + uVar8 * 4);
              if (fVar22 <= fVar23) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar7 + uVar8 * 4) = fVar23;
            }
            pvVar7 = (void *)((long)pvVar7 + lVar19 * 4);
            pvVar16 = (void *)((long)pvVar16 + lVar19 * 4);
          }
        }
      }
      else {
        uVar3 = this_01->h;
        uVar20 = uVar3 * uVar13;
        if (iVar12 != 2) {
          if (iVar12 != 3) {
            return 0;
          }
          uVar18 = this_01->c;
          uVar5 = (ulong)uVar18;
          if (this_01[1].dims != 3) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar22 = *this_00->data;
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                if ((int)uVar18 < 1) {
                  uVar18 = 0;
                }
                for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
                  Mat::channel(&local_88,this_01,uVar13);
                  pvVar7 = local_88.data;
                  Mat::~Mat(&local_88);
                  Mat::channel(&local_88,this_02,uVar13);
                  pvVar9 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                    fVar23 = *(float *)((long)pvVar7 + uVar5 * 4);
                    if (fVar22 <= *(float *)((long)pvVar7 + uVar5 * 4)) {
                      fVar23 = fVar22;
                    }
                    *(float *)((long)pvVar9 + uVar5 * 4) = fVar23;
                  }
                }
                return 0;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar18 < 1) {
                uVar5 = 0;
              }
              for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
                Mat::channel(&local_88,this_01,(int)uVar6);
                pvVar7 = local_88.data;
                Mat::~Mat(&local_88);
                fVar22 = *(float *)((long)this_01[1].data + uVar6 * 4);
                Mat::channel(&local_88,this_02,(int)uVar6);
                pvVar9 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar8 = 0; uVar20 != uVar8; uVar8 = uVar8 + 1) {
                  fVar23 = *(float *)((long)pvVar7 + uVar8 * 4);
                  if (fVar22 <= *(float *)((long)pvVar7 + uVar8 * 4)) {
                    fVar23 = fVar22;
                  }
                  *(float *)((long)pvVar9 + uVar8 * 4) = fVar23;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            local_40 = (void *)(ulong)uVar3;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pfVar11 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              iVar12 = this_01[1].w;
              sVar4 = this_01[1].elemsize;
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pfVar15 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; (void *)uVar6 != local_40; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)pvVar7 +
                                   uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
                for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                  fVar23 = pfVar11[uVar8];
                  if (fVar22 <= pfVar11[uVar8]) {
                    fVar23 = fVar22;
                  }
                  pfVar15[uVar8] = fVar23;
                }
                pfVar15 = pfVar15 + lVar14;
                pfVar11 = pfVar11 + lVar14;
              }
            }
            return 0;
          }
          if ((uVar2 == 1 && uVar1 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = *pvVar9;
                if (*(float *)((long)pvVar7 + uVar5 * 4) <= *pvVar9) {
                  fVar22 = *(float *)((long)pvVar7 + uVar5 * 4);
                }
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          if ((uVar1 == uVar13) && (uVar10 == 1 && uVar2 == uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = *(float *)((long)pvVar7 + uVar5 * 4);
                if (*(float *)((long)pvVar9 + uVar5 * 4) <= fVar22) {
                  fVar22 = *(float *)((long)pvVar9 + uVar5 * 4);
                }
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          if ((uVar3 == 1 && uVar13 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar1,uVar2,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = *(float *)((long)pvVar9 + uVar5 * 4);
                if (*pvVar7 <= *(float *)((long)pvVar9 + uVar5 * 4)) {
                  fVar22 = *pvVar7;
                }
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          if ((uVar1 != uVar13) || (uVar18 != 1 || uVar2 != uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = *(float *)((long)pvVar9 + uVar5 * 4);
                if (*(float *)((long)pvVar7 + uVar5 * 4) <= *(float *)((long)pvVar9 + uVar5 * 4)) {
                  fVar22 = *(float *)((long)pvVar7 + uVar5 * 4);
                }
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pvVar9 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pvVar16 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              fVar22 = *(float *)((long)pvVar7 + uVar5 * 4);
              fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
              if (fVar22 <= *(float *)((long)pvVar9 + uVar5 * 4)) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar16 + uVar5 * 4) = fVar23;
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            iVar12 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pfVar15 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar7 +
                                 uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
              for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                fVar23 = pfVar11[uVar8];
                if (fVar22 <= pfVar11[uVar8]) {
                  fVar23 = fVar22;
                }
                pfVar15[uVar8] = fVar23;
              }
              pfVar15 = pfVar15 + lVar19;
              pfVar11 = pfVar11 + lVar19;
            }
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            fVar22 = *(float *)((long)pvVar16 + uVar5 * 4);
            fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
            if (fVar23 <= fVar22) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar7 + uVar5 * 4) = fVar22;
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar22 = *this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            fVar23 = *(float *)((long)pvVar9 + uVar5 * 4);
            if (fVar22 <= fVar23) {
              fVar23 = fVar22;
            }
            *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar16 = this_01[1].data;
        uVar5 = 0;
        if (0 < (int)uVar13) {
          uVar5 = (ulong)uVar13;
        }
        uVar6 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar6 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          fVar22 = *(float *)((long)pvVar16 + uVar8 * 4);
          for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
            fVar23 = *(float *)((long)pvVar9 + uVar17 * 4);
            if (fVar22 <= fVar23) {
              fVar23 = fVar22;
            }
            *(float *)((long)pvVar7 + uVar17 * 4) = fVar23;
          }
          pvVar7 = (void *)((long)pvVar7 + lVar14 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar14 * 4);
        }
      }
      break;
    case 6:
      uVar13 = this_01->w;
      lVar19 = (long)(int)uVar13;
      sVar4 = this_01->elemsize;
      uVar1 = this_01[1].w;
      lVar14 = (long)(int)uVar1;
      uVar2 = this_01[1].h;
      uVar10 = this_01[1].c;
      local_48 = (ulong)uVar10;
      uVar21 = uVar2 * uVar1;
      iVar12 = this_01->dims;
      if (iVar12 == 1) {
        iVar12 = this_01[1].dims;
        if (uVar13 == 1) {
          if (iVar12 == 1) {
            Mat::create(this_02,uVar1,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            uVar5 = (ulong)uVar1;
            if ((int)uVar1 < 1) {
              uVar5 = 0;
            }
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              fVar23 = powf(fVar22,*(float *)((long)pvVar9 + uVar6 * 4));
              *(float *)((long)pvVar7 + uVar6 * 4) = fVar23;
            }
          }
          else {
            if (iVar12 != 2) {
              if (iVar12 != 3) {
                return 0;
              }
              Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
              if (this_02->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_02->c * this_02->cstep == 0) {
                return -100;
              }
              fVar22 = *this_01->data;
              if ((int)uVar21 < 1) {
                uVar21 = 0;
              }
              iVar12 = (int)local_48;
              local_48 = local_48 & 0xffffffff;
              if (iVar12 < 1) {
                local_48 = 0;
              }
              for (iVar12 = 0; iVar12 != (int)local_48; iVar12 = iVar12 + 1) {
                Mat::channel(&local_88,this_00,iVar12);
                pvVar7 = local_88.data;
                Mat::~Mat(&local_88);
                Mat::channel(&local_88,this_02,iVar12);
                pvVar9 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                  fVar23 = powf(fVar22,*(float *)((long)pvVar7 + uVar5 * 4));
                  *(float *)((long)pvVar9 + uVar5 * 4) = fVar23;
                }
              }
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              fVar23 = powf(fVar22,*(float *)((long)pvVar9 + uVar5 * 4));
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
            }
          }
        }
        else {
          if (iVar12 != 1) {
            if (iVar12 == 2) {
              Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
              pvVar7 = this_02->data;
              if (pvVar7 == (void *)0x0) {
                return -100;
              }
              if ((long)this_02->c * this_02->cstep == 0) {
                return -100;
              }
              pvVar9 = this_01->data;
              pvVar16 = this_01[1].data;
              uVar5 = 0;
              if (0 < (int)uVar1) {
                uVar5 = (ulong)uVar1;
              }
              if ((int)uVar2 < 1) {
                uVar2 = 0;
              }
              for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)pvVar9 + uVar6 * 4);
                for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                  fVar23 = powf(fVar22,*(float *)((long)pvVar16 + uVar8 * 4));
                  *(float *)((long)pvVar7 + uVar8 * 4) = fVar23;
                }
                pvVar7 = (void *)((long)pvVar7 + lVar14 * 4);
                pvVar16 = (void *)((long)pvVar16 + lVar14 * 4);
              }
              return 0;
            }
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            iVar12 = (int)local_48;
            local_48 = local_48 & 0xffffffff;
            if (iVar12 < 1) {
              local_48 = 0;
            }
            for (uVar5 = 0; uVar5 != local_48; uVar5 = uVar5 + 1) {
              fVar22 = *(float *)((long)this_01->data + uVar5 * 4);
              Mat::channel(&local_88,this_00,(int)uVar5);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,(int)uVar5);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; uVar21 != uVar6; uVar6 = uVar6 + 1) {
                fVar23 = powf(fVar22,*(float *)((long)pvVar7 + uVar6 * 4));
                *(float *)((long)pvVar9 + uVar6 * 4) = fVar23;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar13,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w != 1) {
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              fVar22 = powf(*(float *)((long)pvVar9 + uVar6 * 4),
                            *(float *)((long)pvVar16 + uVar6 * 4));
              *(float *)((long)pvVar7 + uVar6 * 4) = fVar22;
            }
            return 0;
          }
          pvVar9 = this_01->data;
          fVar22 = *this_01[1].data;
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
            fVar23 = powf(*(float *)((long)pvVar9 + uVar5 * 4),fVar22);
            *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
          }
        }
      }
      else {
        uVar3 = this_01->h;
        uVar5 = (ulong)uVar3;
        uVar20 = uVar3 * uVar13;
        if (iVar12 == 2) {
          if (this_01[1].dims == 3) {
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            uVar5 = 0;
            if (0 < (int)uVar1) {
              uVar5 = (ulong)uVar1;
            }
            if ((int)uVar2 < 1) {
              uVar2 = 0;
            }
            iVar12 = (int)local_48;
            local_48 = local_48 & 0xffffffff;
            if (iVar12 < 1) {
              local_48 = 0;
            }
            iVar12 = 0;
            while (iVar12 != (int)local_48) {
              local_40 = (void *)((long)iVar12 * (long)this_01->w * this_01->elemsize +
                                 (long)this_01->data);
              Mat::channel(&local_88,this_00,iVar12);
              pfVar11 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              local_34 = iVar12;
              Mat::channel(&local_88,this_02,iVar12);
              pfVar15 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)local_40 + uVar6 * 4);
                for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                  fVar23 = powf(fVar22,pfVar11[uVar8]);
                  pfVar15[uVar8] = fVar23;
                }
                pfVar15 = pfVar15 + lVar14;
                pfVar11 = pfVar11 + lVar14;
              }
              iVar12 = local_34 + 1;
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if ((pvVar7 == (void *)0x0) || ((long)this_02->c * this_02->cstep == 0)) {
            return -100;
          }
          if (this_01[1].dims != 1) {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
              fVar22 = powf(*(float *)((long)pvVar9 + uVar5 * 4),
                            *(float *)((long)pvVar16 + uVar5 * 4));
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar22;
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w != 1) {
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            uVar6 = 0;
            if (0 < (int)uVar13) {
              uVar6 = (ulong)uVar13;
            }
            if ((int)uVar3 < 1) {
              uVar5 = 0;
            }
            for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
              fVar22 = *(float *)((long)pvVar16 + uVar8 * 4);
              for (uVar17 = 0; uVar6 != uVar17; uVar17 = uVar17 + 1) {
                fVar23 = powf(*(float *)((long)pvVar9 + uVar17 * 4),fVar22);
                *(float *)((long)pvVar7 + uVar17 * 4) = fVar23;
              }
              pvVar7 = (void *)((long)pvVar7 + lVar19 * 4);
              pvVar9 = (void *)((long)pvVar9 + lVar19 * 4);
            }
            return 0;
          }
          pvVar9 = this_01->data;
          fVar22 = *this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            fVar23 = powf(*(float *)((long)pvVar9 + uVar5 * 4),fVar22);
            *(float *)((long)pvVar7 + uVar5 * 4) = fVar23;
          }
        }
        else if (iVar12 == 3) {
          uVar18 = this_01->c;
          uVar6 = (ulong)uVar18;
          if (this_01[1].dims != 3) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar22 = *this_00->data;
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                local_48 = (ulong)uVar18;
                if ((int)uVar18 < 1) {
                  local_48 = 0;
                }
                for (iVar12 = 0; iVar12 != (int)local_48; iVar12 = iVar12 + 1) {
                  Mat::channel(&local_88,this_01,iVar12);
                  pvVar7 = local_88.data;
                  Mat::~Mat(&local_88);
                  Mat::channel(&local_88,this_02,iVar12);
                  pvVar9 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                    fVar23 = powf(*(float *)((long)pvVar7 + uVar5 * 4),fVar22);
                    *(float *)((long)pvVar9 + uVar5 * 4) = fVar23;
                  }
                }
                return 0;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              local_48 = (ulong)uVar18;
              if ((int)uVar18 < 1) {
                local_48 = 0;
              }
              for (uVar5 = 0; uVar5 != local_48; uVar5 = uVar5 + 1) {
                Mat::channel(&local_88,this_01,(int)uVar5);
                pvVar7 = local_88.data;
                Mat::~Mat(&local_88);
                fVar22 = *(float *)((long)this_01[1].data + uVar5 * 4);
                Mat::channel(&local_88,this_02,(int)uVar5);
                pvVar9 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar6 = 0; uVar20 != uVar6; uVar6 = uVar6 + 1) {
                  fVar23 = powf(*(float *)((long)pvVar7 + uVar6 * 4),fVar22);
                  *(float *)((long)pvVar9 + uVar6 * 4) = fVar23;
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar8 = 0;
            if (0 < (int)uVar13) {
              uVar8 = (ulong)uVar13;
            }
            if ((int)uVar3 < 1) {
              uVar5 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar6 = 0;
            }
            local_48 = uVar6;
            for (iVar12 = 0; iVar12 != (int)local_48; iVar12 = iVar12 + 1) {
              Mat::channel(&local_88,this_01,iVar12);
              pfVar11 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              local_40 = (void *)((long)iVar12 * (long)this_01[1].w * this_01[1].elemsize +
                                 (long)this_01[1].data);
              Mat::channel(&local_88,this_02,iVar12);
              pfVar15 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)local_40 + uVar6 * 4);
                for (uVar17 = 0; uVar8 != uVar17; uVar17 = uVar17 + 1) {
                  fVar23 = powf(pfVar11[uVar17],fVar22);
                  pfVar15[uVar17] = fVar23;
                }
                pfVar15 = pfVar15 + lVar19;
                pfVar11 = pfVar11 + lVar19;
              }
            }
            return 0;
          }
          if ((uVar2 == 1 && uVar1 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar6 = 0;
            }
            local_48 = uVar6;
            for (iVar12 = 0; iVar12 != (int)local_48; iVar12 = iVar12 + 1) {
              Mat::channel(&local_88,this_01,iVar12);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,iVar12);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,iVar12);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = powf(*(float *)((long)pvVar7 + uVar5 * 4),*pvVar9);
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          if ((uVar1 == uVar13) && (uVar10 == 1 && uVar2 == uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar6 = 0;
            }
            local_48 = uVar6;
            for (iVar12 = 0; iVar12 != (int)local_48; iVar12 = iVar12 + 1) {
              Mat::channel(&local_88,this_01,iVar12);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,iVar12);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = powf(*(float *)((long)pvVar9 + uVar5 * 4),
                              *(float *)((long)pvVar7 + uVar5 * 4));
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          if ((uVar3 == 1 && uVar13 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar1,uVar2,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar6 = 0;
            }
            local_48 = uVar6;
            for (iVar12 = 0; iVar12 != (int)local_48; iVar12 = iVar12 + 1) {
              Mat::channel(&local_88,this_01,iVar12);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,iVar12);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,iVar12);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = powf(*pvVar7,*(float *)((long)pvVar9 + uVar5 * 4));
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          if ((uVar1 != uVar13) || (uVar18 != 1 || uVar2 != uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar6 = 0;
            }
            local_48 = uVar6;
            for (iVar12 = 0; iVar12 != (int)local_48; iVar12 = iVar12 + 1) {
              Mat::channel(&local_88,this_01,iVar12);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,iVar12);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,iVar12);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = powf(*(float *)((long)pvVar7 + uVar5 * 4),
                              *(float *)((long)pvVar9 + uVar5 * 4));
                *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          iVar12 = (int)local_48;
          local_48 = local_48 & 0xffffffff;
          if (iVar12 < 1) {
            local_48 = 0;
          }
          for (iVar12 = 0; iVar12 != (int)local_48; iVar12 = iVar12 + 1) {
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,iVar12);
            pvVar9 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,iVar12);
            pvVar16 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              fVar22 = powf(*(float *)((long)pvVar7 + uVar5 * 4),
                            *(float *)((long)pvVar9 + uVar5 * 4));
              *(float *)((long)pvVar16 + uVar5 * 4) = fVar22;
            }
          }
          return 0;
        }
      }
      break;
    case 7:
      uVar13 = this_01->w;
      lVar14 = (long)(int)uVar13;
      sVar4 = this_01->elemsize;
      uVar1 = this_01[1].w;
      lVar19 = (long)(int)uVar1;
      uVar2 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar5 = (ulong)uVar10;
      uVar21 = uVar2 * uVar1;
      iVar12 = this_01->dims;
      if (iVar12 == 1) {
        iVar12 = this_01[1].dims;
        if (uVar13 == 1) {
          if (iVar12 == 1) {
            Mat::create(this_02,uVar1,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) - fVar22;
            }
          }
          else if (iVar12 == 2) {
            Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = *(float *)((long)pvVar9 + uVar5 * 4) - fVar22;
            }
          }
          else {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            fVar22 = *this_01->data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_00,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar9 + uVar5 * 4) = *(float *)((long)pvVar7 + uVar5 * 4) - fVar22
                ;
              }
            }
          }
        }
        else if (iVar12 == 1) {
          Mat::create(this_02,uVar13,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar22 = *this_01[1].data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar22 - *(float *)((long)pvVar9 + uVar5 * 4);
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar7 + uVar6 * 4) =
                   *(float *)((long)pvVar16 + uVar6 * 4) - *(float *)((long)pvVar9 + uVar6 * 4);
            }
          }
        }
        else {
          if (iVar12 != 2) {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar5 = 0;
            }
            for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)this_01->data + uVar6 * 4);
              Mat::channel(&local_88,this_00,(int)uVar6);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,(int)uVar6);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
                *(float *)((long)pvVar9 + uVar8 * 4) = *(float *)((long)pvVar7 + uVar8 * 4) - fVar22
                ;
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
            fVar22 = *(float *)((long)pvVar9 + uVar6 * 4);
            for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
              *(float *)((long)pvVar7 + uVar8 * 4) = *(float *)((long)pvVar16 + uVar8 * 4) - fVar22;
            }
            pvVar7 = (void *)((long)pvVar7 + lVar19 * 4);
            pvVar16 = (void *)((long)pvVar16 + lVar19 * 4);
          }
        }
      }
      else {
        uVar3 = this_01->h;
        uVar20 = uVar3 * uVar13;
        if (iVar12 != 2) {
          if (iVar12 != 3) {
            return 0;
          }
          uVar18 = this_01->c;
          uVar5 = (ulong)uVar18;
          if (this_01[1].dims != 3) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar22 = *this_00->data;
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                if ((int)uVar18 < 1) {
                  uVar18 = 0;
                }
                for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
                  Mat::channel(&local_88,this_01,uVar13);
                  pvVar7 = local_88.data;
                  Mat::~Mat(&local_88);
                  Mat::channel(&local_88,this_02,uVar13);
                  pvVar9 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                    *(float *)((long)pvVar9 + uVar5 * 4) =
                         fVar22 - *(float *)((long)pvVar7 + uVar5 * 4);
                  }
                }
                return 0;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar18 < 1) {
                uVar5 = 0;
              }
              for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
                Mat::channel(&local_88,this_01,(int)uVar6);
                pvVar7 = local_88.data;
                Mat::~Mat(&local_88);
                fVar22 = *(float *)((long)this_01[1].data + uVar6 * 4);
                Mat::channel(&local_88,this_02,(int)uVar6);
                pvVar9 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar8 = 0; uVar20 != uVar8; uVar8 = uVar8 + 1) {
                  *(float *)((long)pvVar9 + uVar8 * 4) =
                       fVar22 - *(float *)((long)pvVar7 + uVar8 * 4);
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            local_40 = (void *)(ulong)uVar3;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pfVar11 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              iVar12 = this_01[1].w;
              sVar4 = this_01[1].elemsize;
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pfVar15 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; (void *)uVar6 != local_40; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)pvVar7 +
                                   uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
                for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar15[uVar8] = fVar22 - pfVar11[uVar8];
                }
                pfVar15 = pfVar15 + lVar14;
                pfVar11 = pfVar11 + lVar14;
              }
            }
            return 0;
          }
          if ((uVar2 == 1 && uVar1 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *pvVar9 - *(float *)((long)pvVar7 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar1 == uVar13) && (uVar10 == 1 && uVar2 == uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar7 + uVar5 * 4) - *(float *)((long)pvVar9 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == 1 && uVar13 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar1,uVar2,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar9 + uVar5 * 4) - *pvVar7;
              }
            }
            return 0;
          }
          if ((uVar1 != uVar13) || (uVar18 != 1 || uVar2 != uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar9 + uVar5 * 4) - *(float *)((long)pvVar7 + uVar5 * 4);
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pvVar9 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pvVar16 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar16 + uVar5 * 4) =
                   *(float *)((long)pvVar9 + uVar5 * 4) - *(float *)((long)pvVar7 + uVar5 * 4);
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            iVar12 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pfVar15 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar7 +
                                 uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
              for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                pfVar15[uVar8] = pfVar11[uVar8] - fVar22;
              }
              pfVar15 = pfVar15 + lVar19;
              pfVar11 = pfVar11 + lVar19;
            }
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) =
                 *(float *)((long)pvVar16 + uVar5 * 4) - *(float *)((long)pvVar9 + uVar5 * 4);
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar22 = *this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) = fVar22 - *(float *)((long)pvVar9 + uVar5 * 4);
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar16 = this_01[1].data;
        uVar5 = 0;
        if (0 < (int)uVar13) {
          uVar5 = (ulong)uVar13;
        }
        uVar6 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar6 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          fVar22 = *(float *)((long)pvVar16 + uVar8 * 4);
          for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)((long)pvVar7 + uVar17 * 4) = fVar22 - *(float *)((long)pvVar9 + uVar17 * 4);
          }
          pvVar7 = (void *)((long)pvVar7 + lVar14 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar14 * 4);
        }
      }
      break;
    case 8:
      uVar13 = this_01->w;
      lVar14 = (long)(int)uVar13;
      sVar4 = this_01->elemsize;
      uVar1 = this_01[1].w;
      lVar19 = (long)(int)uVar1;
      uVar2 = this_01[1].h;
      uVar10 = this_01[1].c;
      uVar5 = (ulong)uVar10;
      uVar21 = uVar2 * uVar1;
      iVar12 = this_01->dims;
      if (iVar12 == 1) {
        iVar12 = this_01[1].dims;
        if (uVar13 == 1) {
          if (iVar12 == 1) {
            Mat::create(this_02,uVar1,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            fVar22 = *this_01->data;
            for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) =
                   *(float *)((long)pvVar9 + uVar5 * 4) * (1.0 / fVar22);
            }
          }
          else if (iVar12 == 2) {
            Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
            pvVar7 = this_02->data;
            if (pvVar7 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pvVar9 = this_01[1].data;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            fVar22 = *this_01->data;
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) =
                   *(float *)((long)pvVar9 + uVar5 * 4) * (1.0 / fVar22);
            }
          }
          else {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            fVar22 = *this_01->data;
            for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_00,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar9 + uVar5 * 4) =
                     *(float *)((long)pvVar7 + uVar5 * 4) * (1.0 / fVar22);
              }
            }
          }
        }
        else if (iVar12 == 1) {
          Mat::create(this_02,uVar13,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].w == 1) {
            pvVar9 = this_01->data;
            fVar22 = *this_01[1].data;
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar7 + uVar5 * 4) = fVar22 / *(float *)((long)pvVar9 + uVar5 * 4);
            }
          }
          else {
            pvVar9 = this_01->data;
            pvVar16 = this_01[1].data;
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar7 + uVar6 * 4) =
                   *(float *)((long)pvVar16 + uVar6 * 4) / *(float *)((long)pvVar9 + uVar6 * 4);
            }
          }
        }
        else {
          if (iVar12 != 2) {
            if (iVar12 != 3) {
              return 0;
            }
            Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar10 < 1) {
              uVar5 = 0;
            }
            for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)this_01->data + uVar6 * 4);
              Mat::channel(&local_88,this_00,(int)uVar6);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,(int)uVar6);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
                *(float *)((long)pvVar9 + uVar8 * 4) =
                     *(float *)((long)pvVar7 + uVar8 * 4) * (1.0 / fVar22);
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar1,uVar2,sVar4,opt->blob_allocator);
          pvVar7 = this_02->data;
          if (pvVar7 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          pvVar9 = this_01->data;
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          pvVar16 = this_01[1].data;
          for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
            fVar22 = *(float *)((long)pvVar9 + uVar6 * 4);
            for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
              *(float *)((long)pvVar7 + uVar8 * 4) =
                   *(float *)((long)pvVar16 + uVar8 * 4) * (1.0 / fVar22);
            }
            pvVar7 = (void *)((long)pvVar7 + lVar19 * 4);
            pvVar16 = (void *)((long)pvVar16 + lVar19 * 4);
          }
        }
      }
      else {
        uVar3 = this_01->h;
        uVar20 = uVar3 * uVar13;
        if (iVar12 != 2) {
          if (iVar12 != 3) {
            return 0;
          }
          uVar18 = this_01->c;
          uVar5 = (ulong)uVar18;
          if (this_01[1].dims != 3) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].dims == 1) {
              if (this_01[1].w == 1) {
                fVar22 = *this_00->data;
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                if ((int)uVar18 < 1) {
                  uVar18 = 0;
                }
                for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
                  Mat::channel(&local_88,this_01,uVar13);
                  pvVar7 = local_88.data;
                  Mat::~Mat(&local_88);
                  Mat::channel(&local_88,this_02,uVar13);
                  pvVar9 = local_88.data;
                  Mat::~Mat(&local_88);
                  for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                    *(float *)((long)pvVar9 + uVar5 * 4) =
                         fVar22 / *(float *)((long)pvVar7 + uVar5 * 4);
                  }
                }
                return 0;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if ((int)uVar18 < 1) {
                uVar5 = 0;
              }
              for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
                Mat::channel(&local_88,this_01,(int)uVar6);
                pvVar7 = local_88.data;
                Mat::~Mat(&local_88);
                fVar22 = *(float *)((long)this_01[1].data + uVar6 * 4);
                Mat::channel(&local_88,this_02,(int)uVar6);
                pvVar9 = local_88.data;
                Mat::~Mat(&local_88);
                for (uVar8 = 0; uVar20 != uVar8; uVar8 = uVar8 + 1) {
                  *(float *)((long)pvVar9 + uVar8 * 4) =
                       fVar22 / *(float *)((long)pvVar7 + uVar8 * 4);
                }
              }
              return 0;
            }
            if (this_01[1].dims != 2) {
              return 0;
            }
            uVar5 = 0;
            if (0 < (int)uVar13) {
              uVar5 = (ulong)uVar13;
            }
            if ((int)uVar3 < 1) {
              uVar3 = 0;
            }
            local_40 = (void *)(ulong)uVar3;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pfVar11 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              iVar12 = this_01[1].w;
              sVar4 = this_01[1].elemsize;
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pfVar15 = (float *)local_88.data;
              Mat::~Mat(&local_88);
              for (uVar6 = 0; (void *)uVar6 != local_40; uVar6 = uVar6 + 1) {
                fVar22 = *(float *)((long)pvVar7 +
                                   uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
                for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                  pfVar15[uVar8] = fVar22 / pfVar11[uVar8];
                }
                pfVar15 = pfVar15 + lVar14;
                pfVar11 = pfVar11 + lVar14;
              }
            }
            return 0;
          }
          if ((uVar2 == 1 && uVar1 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *pvVar9 / *(float *)((long)pvVar7 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar1 == uVar13) && (uVar10 == 1 && uVar2 == uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar7 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar7 + uVar5 * 4) / *(float *)((long)pvVar9 + uVar5 * 4);
              }
            }
            return 0;
          }
          if ((uVar3 == 1 && uVar13 == 1) && (uVar10 ^ uVar18) == 0) {
            Mat::create(this_02,uVar1,uVar2,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar9 + uVar5 * 4) / *pvVar7;
              }
            }
            return 0;
          }
          if ((uVar1 != uVar13) || (uVar18 != 1 || uVar2 != uVar3)) {
            Mat::create(this_02,uVar13,uVar3,uVar18,sVar4,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
              Mat::channel(&local_88,this_01,uVar13);
              pvVar7 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar13);
              pvVar9 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar13);
              pvVar16 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
                *(float *)((long)pvVar16 + uVar5 * 4) =
                     *(float *)((long)pvVar9 + uVar5 * 4) / *(float *)((long)pvVar7 + uVar5 * 4);
              }
            }
            return 0;
          }
          Mat::create(this_02,uVar13,uVar3,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar21 < 1) {
            uVar21 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pvVar9 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pvVar16 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar21 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar16 + uVar5 * 4) =
                   *(float *)((long)pvVar9 + uVar5 * 4) / *(float *)((long)pvVar7 + uVar5 * 4);
            }
          }
          return 0;
        }
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar1,uVar2,uVar10,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar5 = 0;
          if (0 < (int)uVar1) {
            uVar5 = (ulong)uVar1;
          }
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
            iVar12 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar7 = this_01->data;
            Mat::channel(&local_88,this_00,uVar13);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar13);
            pfVar15 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
              fVar22 = *(float *)((long)pvVar7 +
                                 uVar6 * 4 + (long)(int)uVar13 * (long)iVar12 * sVar4);
              for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
                pfVar15[uVar8] = pfVar11[uVar8] * (1.0 / fVar22);
              }
              pfVar15 = pfVar15 + lVar19;
              pfVar11 = pfVar11 + lVar19;
            }
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if ((pvVar7 == (void *)0x0) || ((long)this_02->c * this_02->cstep == 0)) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar9 = this_01->data;
          pvVar16 = this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) =
                 *(float *)((long)pvVar16 + uVar5 * 4) / *(float *)((long)pvVar9 + uVar5 * 4);
          }
          return 0;
        }
        Mat::create(this_02,uVar13,uVar3,sVar4,opt->blob_allocator);
        pvVar7 = this_02->data;
        if (pvVar7 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar22 = *this_01[1].data;
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar7 + uVar5 * 4) = fVar22 / *(float *)((long)pvVar9 + uVar5 * 4);
          }
          return 0;
        }
        pvVar9 = this_01->data;
        pvVar16 = this_01[1].data;
        uVar5 = 0;
        if (0 < (int)uVar13) {
          uVar5 = (ulong)uVar13;
        }
        uVar6 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar6 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          fVar22 = *(float *)((long)pvVar16 + uVar8 * 4);
          for (uVar17 = 0; uVar5 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)((long)pvVar7 + uVar17 * 4) = fVar22 / *(float *)((long)pvVar9 + uVar17 * 4);
          }
          pvVar7 = (void *)((long)pvVar7 + lVar14 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar14 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op< std::plus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op< std::minus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op< std::multiplies<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op< std::divides<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op< binary_op_max<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op< binary_op_min<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op< binary_op_pow<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op< binary_op_rsub<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op< binary_op_rdiv<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}